

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O1

void av1_loop_filter_frame_init(AV1_COMMON *cm,int plane_start,int plane_end)

{
  uint8_t (*paauVar1) [8] [2];
  uint8_t uVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  uint8_t (*pauVar10) [2];
  long lVar11;
  uint8_t (*pauVar12) [2];
  long lVar13;
  bool bVar14;
  undefined4 uVar15;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 auVar16 [16];
  int filt_lvl_r [3];
  int filt_lvl [3];
  uint8_t (*local_70) [2];
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  uint8_t (*local_50) [8] [2] [8] [2];
  uint8_t (*local_48) [8] [2] [8] [2];
  uint8_t (*local_40) [2];
  int16_t (*local_38) [8];
  
  update_sharpness(&cm->lf_info,(cm->lf).sharpness_level);
  local_5c = (cm->lf).filter_level[0];
  local_58 = (cm->lf).filter_level_u;
  local_54 = (cm->lf).filter_level_v;
  local_68 = (cm->lf).filter_level[1];
  local_64 = local_58;
  local_60 = local_54;
  if (plane_start < plane_end) {
    local_38 = (cm->seg).feature_data;
    local_50 = (cm->lf_info).lvl;
    lVar11 = (long)plane_start;
    local_70 = (cm->lf_info).lvl[lVar11][0][0] + 1;
    do {
      if ((lVar11 == 0 && local_5c == 0) && local_68 == 0) {
        return;
      }
      if ((lVar11 != 1 || local_58 != 0) && (lVar11 != 2 || local_54 != 0)) {
        local_48 = local_50 + lVar11;
        lVar9 = 0;
        local_40 = local_70;
        do {
          lVar8 = 0;
          pauVar10 = local_40;
          do {
            piVar4 = &local_68;
            if (lVar8 == 0) {
              piVar4 = &local_5c;
            }
            iVar7 = piVar4[lVar11];
            if (((cm->seg).enabled != '\0') &&
               (((cm->seg).feature_mask[lVar9] >> (seg_lvl_lf_lut[lVar11][lVar8] & 0x1f) & 1) != 0))
            {
              iVar7 = iVar7 + local_38[lVar9][(uint)seg_lvl_lf_lut[lVar11][lVar8]];
              if (0x3e < iVar7) {
                iVar7 = 0x3f;
              }
              if (iVar7 < 1) {
                iVar7 = 0;
              }
            }
            if ((cm->lf).mode_ref_delta_enabled == '\0') {
              uVar19 = (undefined1)((uint)iVar7 >> 0x18);
              uVar18 = (undefined1)((uint)iVar7 >> 0x10);
              uVar17 = (undefined1)((uint)iVar7 >> 8);
              auVar16._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar19,uVar19),uVar18),CONCAT14(uVar18,iVar7))
                        >> 0x20);
              auVar16[3] = uVar17;
              auVar16[2] = uVar17;
              auVar16[0] = (undefined1)iVar7;
              auVar16[1] = auVar16[0];
              auVar16._8_8_ = 0;
              auVar16 = pshuflw(auVar16,auVar16,0);
              uVar15 = auVar16._0_4_;
              paauVar1 = (*local_48)[lVar9] + lVar8;
              *(undefined4 *)*paauVar1 = uVar15;
              *(undefined4 *)(*paauVar1 + 2) = uVar15;
              *(undefined4 *)(*paauVar1 + 4) = uVar15;
              *(undefined4 *)(*paauVar1 + 6) = uVar15;
            }
            else {
              bVar6 = (byte)(iVar7 >> 5);
              iVar3 = ((int)(cm->lf).ref_deltas[0] << (bVar6 & 0x1f)) + iVar7;
              if (0x3e < iVar3) {
                iVar3 = 0x3f;
              }
              uVar2 = (uint8_t)iVar3;
              if (iVar3 < 1) {
                uVar2 = '\0';
              }
              (*local_48)[lVar9][lVar8][0][0] = uVar2;
              lVar5 = 1;
              pauVar12 = pauVar10;
              do {
                lVar13 = 0;
                do {
                  iVar3 = ((int)(cm->lf).mode_deltas[lVar13] + (int)(cm->lf).ref_deltas[lVar5] <<
                          (bVar6 & 0x1f)) + iVar7;
                  if (0x3e < iVar3) {
                    iVar3 = 0x3f;
                  }
                  if (iVar3 < 1) {
                    iVar3 = 0;
                  }
                  (*pauVar12)[lVar13] = (uint8_t)iVar3;
                  lVar13 = lVar13 + 1;
                } while (lVar13 == 1);
                lVar5 = lVar5 + 1;
                pauVar12 = pauVar12 + 1;
              } while (lVar5 != 8);
            }
            pauVar10 = pauVar10 + 8;
            bVar14 = lVar8 == 0;
            lVar8 = lVar8 + 1;
          } while (bVar14);
          lVar9 = lVar9 + 1;
          local_40 = local_40 + 0x10;
        } while (lVar9 != 8);
      }
      lVar11 = lVar11 + 1;
      local_70 = local_70 + 0x80;
    } while ((int)lVar11 != plane_end);
  }
  return;
}

Assistant:

void av1_loop_filter_frame_init(AV1_COMMON *cm, int plane_start,
                                int plane_end) {
  int filt_lvl[MAX_MB_PLANE], filt_lvl_r[MAX_MB_PLANE];
  int plane;
  int seg_id;
  // n_shift is the multiplier for lf_deltas
  // the multiplier is 1 for when filter_lvl is between 0 and 31;
  // 2 when filter_lvl is between 32 and 63
  loop_filter_info_n *const lfi = &cm->lf_info;
  struct loopfilter *const lf = &cm->lf;
  const struct segmentation *const seg = &cm->seg;

  // update sharpness limits
  update_sharpness(lfi, lf->sharpness_level);

  filt_lvl[0] = cm->lf.filter_level[0];
  filt_lvl[1] = cm->lf.filter_level_u;
  filt_lvl[2] = cm->lf.filter_level_v;

  filt_lvl_r[0] = cm->lf.filter_level[1];
  filt_lvl_r[1] = cm->lf.filter_level_u;
  filt_lvl_r[2] = cm->lf.filter_level_v;

  assert(plane_start >= AOM_PLANE_Y);
  assert(plane_end <= MAX_MB_PLANE);

  for (plane = plane_start; plane < plane_end; plane++) {
    if (plane == 0 && !filt_lvl[0] && !filt_lvl_r[0])
      break;
    else if (plane == 1 && !filt_lvl[1])
      continue;
    else if (plane == 2 && !filt_lvl[2])
      continue;

    for (seg_id = 0; seg_id < MAX_SEGMENTS; seg_id++) {
      for (int dir = 0; dir < 2; ++dir) {
        int lvl_seg = (dir == 0) ? filt_lvl[plane] : filt_lvl_r[plane];
        const int seg_lf_feature_id = seg_lvl_lf_lut[plane][dir];
        if (segfeature_active(seg, seg_id, seg_lf_feature_id)) {
          const int data = get_segdata(&cm->seg, seg_id, seg_lf_feature_id);
          lvl_seg = clamp(lvl_seg + data, 0, MAX_LOOP_FILTER);
        }

        if (!lf->mode_ref_delta_enabled) {
          // we could get rid of this if we assume that deltas are set to
          // zero when not in use; encoder always uses deltas
          memset(lfi->lvl[plane][seg_id][dir], lvl_seg,
                 sizeof(lfi->lvl[plane][seg_id][dir]));
        } else {
          int ref, mode;
          const int scale = 1 << (lvl_seg >> 5);
          const int intra_lvl = lvl_seg + lf->ref_deltas[INTRA_FRAME] * scale;
          lfi->lvl[plane][seg_id][dir][INTRA_FRAME][0] =
              clamp(intra_lvl, 0, MAX_LOOP_FILTER);

          for (ref = LAST_FRAME; ref < REF_FRAMES; ++ref) {
            for (mode = 0; mode < MAX_MODE_LF_DELTAS; ++mode) {
              const int inter_lvl = lvl_seg + lf->ref_deltas[ref] * scale +
                                    lf->mode_deltas[mode] * scale;
              lfi->lvl[plane][seg_id][dir][ref][mode] =
                  clamp(inter_lvl, 0, MAX_LOOP_FILTER);
            }
          }
        }
      }
    }
  }
}